

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall CS248::DynamicScene::Scene::draw_spline_curves(Scene *this,Timeline *timeline)

{
  undefined4 uVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  SceneObject *pSVar5;
  SceneObject *pSVar6;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  _Self __tmp;
  double dVar10;
  double time;
  Vector3D p;
  
  glPushAttrib(0xfffff);
  glEnable(0xbe2);
  glDisable(0xb50);
  glBlendFunc(0x302,0x303);
  glEnable(0xb10);
  glHint(0xc51,0x1102);
  for (p_Var8 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(this->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    pSVar5 = *(SceneObject **)(p_Var8 + 1);
    pSVar6 = (this->selected).object;
    iVar7 = Timeline::getMaxFrame(timeline);
    glLineWidth(0x40400000);
    uVar1 = *(undefined4 *)(&DAT_001e5d78 + (ulong)(pSVar5 == pSVar6) * 4);
    glColor4f(0x3f800000,0x3f800000,0x3f800000);
    glBegin(3);
    for (time = 0.0; time <= (double)iVar7; time = time + 1.0) {
      Spline<CS248::Vector3D>::operator()(&p,&pSVar5->positions,time);
      glDisable(0xbe2);
      dVar10 = (double)((int)time % 0x14) / 19.0;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      glColor4f((float)dVar10,(float)dVar10,0x3f800000,0x3f800000);
      glVertex3d(p.x,p.y,p.z);
      glEnable(0xbe2);
    }
    glEnd();
    if (pSVar5 == pSVar6) {
      iVar7 = Timeline::getCurrentFrame(timeline);
      Timeline::getMaxFrame(timeline);
      Spline<CS248::Vector3D>::operator()(&p,&pSVar5->positions,(double)iVar7);
      glColor4f(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
      glPointSize(0x41700000);
      glBegin(0);
      glVertex3d(p.x,p.y,p.z);
      glEnd();
      for (p_Var9 = *(_Base_ptr *)
                     ((long)&(pSVar5->positions).knots._M_t._M_impl.super__Rb_tree_header._M_header
                     + 0x10);
          (_Rb_tree_header *)p_Var9 != &(pSVar5->positions).knots._M_t._M_impl.super__Rb_tree_header
          ; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        p_Var2 = p_Var9[1]._M_parent;
        p_Var3 = p_Var9[1]._M_left;
        p_Var4 = p_Var9[1]._M_right;
        glColor4f(0x3f800000,0x3f800000,0x3f800000,uVar1);
        glPointSize(0x41200000);
        glBegin(0);
        glVertex3d(p_Var2,p_Var3,p_Var4);
        glEnd();
      }
    }
  }
  glEnable(0xb50);
  glPopAttrib();
  return;
}

Assistant:

void Scene::draw_spline_curves(Timeline &timeline) {
  const double nSamplesPerTick = 1.;
  const double tangentLengthScale = 5.;
  const double controlPointScale = 10.;

  glPushAttrib(GL_ALL_ATTRIB_BITS);

  glEnable(GL_BLEND);
  glDisable(GL_LIGHTING);
  glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

  // use round (rather than square) points
  glEnable(GL_POINT_SMOOTH);
  glHint(GL_POINT_SMOOTH_HINT, GL_NICEST);
  for (SceneObject *obj : objects) {
    bool selected = (obj == this->selected.object);
    double alpha = selected ? 1. : .5;
    Spline<Vector3D> &spline = obj->positions;
    // approximate spline by line segments
    const double maxTime = timeline.getMaxFrame();
    glLineWidth(3.);
    glColor4f(1., 1., 1., alpha);
    glBegin(GL_LINE_STRIP);
    for (double t = 0; t <= maxTime; t += 1. / nSamplesPerTick) {
      Vector3D p = spline(t);

      /* Zach: This is all complicated stuff to make the spline appear as
       * shifting
       * in hue as time progresses, to give an impression of how fast it's going
       */
      double frac = t / maxTime;
      double lum = 0.5;
      double sat = 1.0;
      double tmp1 = (lum < 0.5) ? (lum * (1.0 + sat)) : (lum + sat - lum * sat);
      double tmp2 = 2 * lum - tmp1;
      double hue = frac;
      double tmpR = hue + 0.333;
      double tmpG = hue;
      double tmpB = hue - 0.333;
      tmpR = (tmpR < 0) ? (tmpR + 1) : ((tmpR > 1) ? (tmpR - 1) : tmpR);
      tmpG = (tmpG < 0) ? (tmpG + 1) : ((tmpG > 1) ? (tmpG - 1) : tmpG);
      tmpB = (tmpB < 0) ? (tmpB + 1) : ((tmpB > 1) ? (tmpB - 1) : tmpB);

      double R = 1.0, G = 1.0, B = 1.0;
      if (6 * tmpR < 1) {
        R = tmp2 + (tmp1 - tmp2) * 6 * tmpR;
      } else if (2 * tmpR < 1) {
        R = tmp1;
      } else if (3 * tmpR < 2) {
        R = tmp2 + (tmp1 - tmp2) * (0.666 - tmpR) * 6;
      } else {
        R = tmp2;
      }

      if (6 * tmpG < 1) {
        G = tmp2 + (tmp1 - tmp2) * 6 * tmpG;
      } else if (2 * tmpG < 1) {
        G = tmp1;
      } else if (3 * tmpG < 2) {
        G = tmp2 + (tmp1 - tmp2) * (0.666 - tmpG) * 6;
      } else {
        G = tmp2;
      }

      if (6 * tmpB < 1) {
        B = tmp2 + (tmp1 - tmp2) * 6 * tmpB;
      } else if (2 * tmpB < 1) {
        B = tmp1;
      } else if (3 * tmpB < 2) {
        B = tmp2 + (tmp1 - tmp2) * (0.666 - tmpB) * 6;
      } else {
        B = tmp2;
      }

      glDisable(GL_BLEND);
      int ticks_per_line = 20;
      float color = sqrt(((int)t % ticks_per_line) / (ticks_per_line - 1.0));

      glColor4f(color, color, 1.0, 1.0);
      glVertex3d(p.x, p.y, p.z);
      glEnable(GL_BLEND);
    }
    glEnd();
    if (selected) {
      // draw dot for current position
      double t0 = timeline.getCurrentFrame();
      double fractionThrough = t0 / timeline.getMaxFrame();
      Vector3D p0 = spline(t0);
      glColor4f(1., 1., 1., alpha);
      glPointSize(controlPointScale * 1.5);
      glBegin(GL_POINTS);
      glVertex3d(p0.x, p0.y, p0.z);
      glEnd();
      // draw control points, tangents, and curvature
      for (Spline<Vector3D>::KnotCIter k = spline.knots.begin();
           k != spline.knots.end(); k++) {
        double t = k->first;
        Vector3D P = k->second;                                   // position
        Vector3D T = tangentLengthScale * spline.evaluate(t, 1);  // tangent
        Vector3D A =
            tangentLengthScale * spline.evaluate(t, 2);  // acceleration
        glColor4f(1., 1., 1., alpha);
        glPointSize(controlPointScale);
        glBegin(GL_POINTS);
        glVertex3d(P.x, P.y, P.z);
        glEnd();
      }
    }
  }
  glEnable(GL_LIGHTING);
  glPopAttrib();
}